

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_decoder_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PriceSyncDecoderTest_TestDecodingAnUncompressedMessage_Test::
~PriceSyncDecoderTest_TestDecodingAnUncompressedMessage_Test
          (PriceSyncDecoderTest_TestDecodingAnUncompressedMessage_Test *this)

{
  (this->super_PriceSyncDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceSyncDecoderTest_002977d0;
  *(code **)&(this->super_PriceSyncDecoderTest).data_dictionary =
       bidfx_public_api::tools::ByteBuffer::WriteShort;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
               *)&(this->super_PriceSyncDecoderTest).field_0x50);
  std::
  _Rb_tree<int,_std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
               *)&(this->super_PriceSyncDecoderTest).field_0x20);
  bidfx_public_api::price::pixie::PriceSyncDecoder::~PriceSyncDecoder
            (&(this->super_PriceSyncDecoderTest).decoder);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST_F(PriceSyncDecoderTest, TestDecodingAnUncompressedMessage)
{
    ByteBuffer buffer = BufferUtil::HexBuffer("500007b6b0b1e4f12c2f0403660004003ff8000000000000010000000000000bb8023ff8ac083126e979030000000000000bb8660104003ff5b645a1cac0830100000000000007d0023ff5d70a3d70a3d70300000000000007d06602040040015604189374bc0100000000000011940240017ae147ae147b030000000000001194");
    EXPECT_EQ('P', buffer.ReadByte());
    PriceSync price_sync = decoder.DecodePriceSync(buffer);
    EXPECT_EQ(7, price_sync.GetRevision());
    EXPECT_EQ(1542372218934, price_sync.GetRevisionTime());
    EXPECT_EQ(47, price_sync.GetConflationLatency());
    EXPECT_EQ(4, price_sync.GetEdition());
    EXPECT_EQ(3, price_sync.GetSize());
    EXPECT_FALSE(price_sync.IsCompressed());

    std::deque<std::shared_ptr<PriceEvent>> events;
    auto syncable = QueueingPriceSyncListener(&events);
    price_sync.Visit(data_dictionary, syncable);

    ASSERT_FALSE(events.empty());

    std::shared_ptr<PriceEvent> event = events.front();
    events.pop_front();
    std::map<std::string, PriceField> expected1;
    expected1.emplace("Ask", PriceField(1.542));
    expected1.emplace("AskSize", PriceField(3000));
    expected1.emplace("Bid", PriceField(1.5));
    expected1.emplace("BidSize", PriceField(3000));
    EXPECT_EQ(0, event->GetSid());
    ExpectPriceImageEvent(*event);
    ExpectPriceContains(expected1, *event);

    event = events.front();
    events.pop_front();
    std::map<std::string, PriceField> expected2;
    expected2.emplace("Ask", PriceField(1.365));
    expected2.emplace("AskSize", PriceField(2000));
    expected2.emplace("Bid", PriceField(1.357));
    expected2.emplace("BidSize", PriceField(2000));
    EXPECT_EQ(1, event->GetSid());
    ExpectPriceImageEvent(*event);
    ExpectPriceContains(expected2, *event);

    event = events.front();
    events.pop_front();
    std::map<std::string, PriceField> expected3;
    expected3.emplace("Ask", PriceField(2.185));
    expected3.emplace("AskSize", PriceField(4500));
    expected3.emplace("Bid", PriceField(2.167));
    expected3.emplace("BidSize", PriceField(4500));
    EXPECT_EQ(2, event->GetSid());
    ExpectPriceImageEvent(*event);
    ExpectPriceContains(expected3, *event);

    EXPECT_TRUE(events.empty());
}